

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t owner_excluded(archive_match *a,archive_entry *entry)

{
  long lVar1;
  wchar_t wVar2;
  int64_t iVar3;
  archive_entry *in_RSI;
  match_list *in_RDI;
  wchar_t r;
  archive_entry *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  wchar_t *name;
  match_list *in_stack_ffffffffffffffc0;
  archive_match *in_stack_ffffffffffffffc8;
  
  if (*(long *)&in_RDI[8].unmatched_eof != 0) {
    iVar3 = archive_entry_uid(in_RSI);
    wVar2 = match_owner_id((id_array *)&in_RDI[8].unmatched_next,iVar3);
    if (wVar2 == L'\0') {
      return L'\x01';
    }
  }
  lVar1._0_4_ = in_RDI[9].count;
  lVar1._4_4_ = in_RDI[9].unmatched_count;
  if (lVar1 != 0) {
    iVar3 = archive_entry_gid(in_RSI);
    wVar2 = match_owner_id((id_array *)&in_RDI[9].last,iVar3);
    if (wVar2 == L'\0') {
      return L'\x01';
    }
  }
  if (*(int *)&in_RDI[10].last != 0) {
    in_stack_ffffffffffffffc8 = (archive_match *)&in_RDI[9].unmatched_eof;
    in_stack_ffffffffffffffc0 = in_RDI;
    archive_entry_uname(in_stack_ffffffffffffffa8);
    wVar2 = match_owner_name_mbs
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
    if (wVar2 == L'\0') {
      return L'\x01';
    }
    if (wVar2 < L'\0') {
      return wVar2;
    }
  }
  if (*(int *)&in_RDI[0xb].last != 0) {
    name = &in_RDI[10].unmatched_eof;
    archive_entry_gname(in_stack_ffffffffffffffa8);
    wVar2 = match_owner_name_mbs(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(char *)name);
    if (wVar2 == L'\0') {
      return L'\x01';
    }
    if (wVar2 < L'\0') {
      return wVar2;
    }
  }
  return L'\0';
}

Assistant:

static int
owner_excluded(struct archive_match *a, struct archive_entry *entry)
{
	int r;

	if (a->inclusion_uids.count) {
		if (!match_owner_id(&(a->inclusion_uids),
		    archive_entry_uid(entry)))
			return (1);
	}

	if (a->inclusion_gids.count) {
		if (!match_owner_id(&(a->inclusion_gids),
		    archive_entry_gid(entry)))
			return (1);
	}

	if (a->inclusion_unames.count) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = match_owner_name_wcs(a, &(a->inclusion_unames),
			archive_entry_uname_w(entry));
#else
		r = match_owner_name_mbs(a, &(a->inclusion_unames),
			archive_entry_uname(entry));
#endif
		if (!r)
			return (1);
		else if (r < 0)
			return (r);
	}

	if (a->inclusion_gnames.count) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = match_owner_name_wcs(a, &(a->inclusion_gnames),
			archive_entry_gname_w(entry));
#else
		r = match_owner_name_mbs(a, &(a->inclusion_gnames),
			archive_entry_gname(entry));
#endif
		if (!r)
			return (1);
		else if (r < 0)
			return (r);
	}
	return (0);
}